

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

int __thiscall cmCursesMainForm::Configure(cmCursesMainForm *this,int noconfigure)

{
  cmake *this_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  cmCursesLongMessageForm *this_01;
  uint uVar4;
  int iVar5;
  string *path;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar5 = -1;
  uVar8 = 0xffffffff;
  uVar4 = 0xffffffff;
  if (_stdscr != 0) {
    uVar8 = (int)*(short *)(_stdscr + 4) + 1;
    uVar4 = (int)*(short *)(_stdscr + 6) + 1;
  }
  move(1,1);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Configuring, please wait...");
  PrintKeys(this,1);
  if (_stdscr != 0) {
    iVar5 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar5);
  refresh();
  cmake::SetProgressCallback(this->CMakeInstance,UpdateProgress,this);
  FillCacheManagerFromUI(this);
  this_00 = this->CMakeInstance;
  pcVar3 = cmake::GetHomeOutputDirectory(this_00);
  std::__cxx11::string::string((string *)&local_68,pcVar3,(allocator *)&local_48);
  path = &local_68;
  cmake::SaveCache(this_00,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    path = (string *)(local_68.field_2._M_allocated_capacity + 1);
    operator_delete(local_68._M_dataplus._M_p,(ulong)path);
  }
  LoadCache(this,(char *)path);
  local_68.field_2._M_allocated_capacity =
       (size_type)
       (this->Errors).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_dataplus._M_p =
       (pointer)(this->Errors).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_string_length =
       (size_type)
       (this->Errors).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->Errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  this->OkToGenerate = true;
  if (noconfigure == 0) {
    uVar2 = cmake::Configure(this->CMakeInstance);
  }
  else {
    uVar2 = cmake::DoPreConfigureChecks(this->CMakeInstance);
    this->OkToGenerate = false;
    uVar2 = (int)uVar2 >> 0x1f & uVar2;
  }
  cmake::SetProgressCallback(this->CMakeInstance,(ProgressCallbackType)0x0,(void *)0x0);
  keypad(_stdscr,1);
  if ((uVar2 != 0) ||
     ((this->Errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((cmSystemTools::s_ErrorOccured != false) ||
       ((cmSystemTools::s_FatalErrorOccured != false ||
        (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)))) {
      this->OkToGenerate = false;
    }
    if (_stdscr == 0) {
      uVar6 = 0xffffffff;
      uVar7 = 0xffffffff;
    }
    else {
      uVar6 = (int)*(short *)(_stdscr + 4) + 1;
      uVar7 = (int)*(short *)(_stdscr + 6) + 1;
    }
    this_01 = (cmCursesLongMessageForm *)operator_new(0x60);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) {
      pcVar3 = "Errors occurred during the last pass.";
    }
    else {
      pcVar3 = "CMake produced the following output.";
    }
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_01,&this->Errors,pcVar3);
    cmSystemTools::s_FatalErrorOccured = false;
    cmSystemTools::s_ErrorOccured = false;
    cmCursesForm::CurrentForm = (cmCursesForm *)this_01;
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[3])(this_01,1,1,(ulong)uVar7,(ulong)uVar6);
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[2])(this_01);
    if (uVar2 == 0xfffffffe) {
      return -2;
    }
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar7,(ulong)uVar6);
  }
  InitializeUI(this);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar4,(ulong)uVar8);
  return 0;
}

Assistant:

int cmCursesMainForm::Configure(int noconfigure)
{
  int xi,yi;
  getmaxyx(stdscr, yi, xi);

  curses_move(1,1);
  this->UpdateStatusBar("Configuring, please wait...");
  this->PrintKeys(1);
  touchwin(stdscr);
  refresh();
  this->CMakeInstance->SetProgressCallback(cmCursesMainForm::UpdateProgress, this);

  // always save the current gui values to disk
  this->FillCacheManagerFromUI();
  this->CMakeInstance->SaveCache(
    this->CMakeInstance->GetHomeOutputDirectory());
  this->LoadCache(0);

  // Get rid of previous errors
  this->Errors = std::vector<std::string>();

  // run the generate process
  this->OkToGenerate = true;
  int retVal;
  if ( noconfigure )
    {
    retVal = this->CMakeInstance->DoPreConfigureChecks();
    this->OkToGenerate = false;
    if ( retVal > 0 )
      {
      retVal = 0;
      }
    }
  else
    {
    retVal = this->CMakeInstance->Configure();
    }
  this->CMakeInstance->SetProgressCallback(0, 0);

  keypad(stdscr,TRUE); /* Use key symbols as
                          KEY_DOWN*/

  if( retVal != 0 || !this->Errors.empty())
    {
    // see if there was an error
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      this->OkToGenerate = false;
      }
    int xx,yy;
    getmaxyx(stdscr, yy, xx);
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Errors,
      cmSystemTools::GetErrorOccuredFlag()
      ? "Errors occurred during the last pass." :
      "CMake produced the following output.");
    // reset error condition
    cmSystemTools::ResetErrorOccuredFlag();
    CurrentForm = msgs;
    msgs->Render(1,1,xx,yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if ( retVal == -2 )
      {
      return retVal;
      }
    CurrentForm = this;
    this->Render(1,1,xx,yy);
    }

  this->InitializeUI();
  this->Render(1, 1, xi, yi);

  return 0;
}